

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  WebPMuxError WVar5;
  WebPImageReader p_Var6;
  WebPAnimEncoder *enc;
  WebPMux *mux;
  long lVar7;
  char *pcVar8;
  uint8_t *data;
  uint32_t features;
  WebPData webp_data;
  WebPAnimEncoderOptions anim_config;
  CommandLineArguments cmd_args;
  WebPConfig config;
  WebPPicture pic;
  uint local_264;
  WebPMuxAnimParams local_260;
  int local_254;
  char *local_250;
  ulong local_248;
  ulong local_240;
  uint local_238;
  uint local_234;
  ulong local_230;
  size_t local_228;
  int local_21c;
  WebPData local_218;
  WebPAnimEncoderOptions local_1fc;
  CommandLineArguments local_1d0;
  WebPConfig local_1a4;
  WebPPicture local_130;
  
  uVar1 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&local_1d0);
  if (uVar1 == 0) {
    return 1;
  }
  local_218.bytes = (uint8_t *)0x0;
  local_218.size = 0;
  iVar2 = WebPAnimEncoderOptionsInitInternal(&local_1fc,0x108);
  if (((iVar2 == 0) ||
      (iVar2 = WebPConfigInitInternal(&local_1a4,WEBP_PRESET_DEFAULT,75.0,0x20f), iVar2 == 0)) ||
     (iVar2 = WebPPictureInitInternal(&local_130,0x20f), iVar2 == 0)) {
    main_cold_4();
    enc = (WebPAnimEncoder *)0x0;
    local_248 = 0;
    local_264 = 0;
    pcVar8 = (char *)0x0;
LAB_001054bd:
    iVar2 = 0;
  }
  else {
    local_248 = 0;
    local_240 = (ulong)uVar1;
    if (local_1d0.argc_ < 1) {
      local_264 = 0;
      local_250 = (char *)0x0;
    }
    else {
      local_230 = 0;
      iVar2 = 0;
      local_264 = 0;
      local_21c = 0;
      local_250 = (char *)0x0;
      do {
        lVar7 = (long)iVar2;
        pcVar8 = local_1d0.argv_[lVar7];
        if (*pcVar8 != '-') {
          iVar2 = iVar2 + 1;
          lVar7 = (long)iVar2 + -1;
          do {
            if (local_1d0.argc_ <= iVar2) goto LAB_00104f04;
            pcVar8 = local_1d0.argv_[lVar7 + 1];
            lVar7 = lVar7 + 1;
            iVar2 = iVar2 + 1;
          } while (*pcVar8 != '-');
          local_230 = 1;
          iVar2 = (int)lVar7;
        }
        local_260 = (WebPMuxAnimParams)((ulong)local_260 & 0xffffffff00000000);
        if (((*pcVar8 == '-') && (pcVar8[1] == 'o')) &&
           ((pcVar8[2] == '\0' && (iVar3 = iVar2 + 1, iVar3 < local_1d0.argc_)))) {
          local_1d0.argv_[lVar7] = (char *)0x0;
          local_250 = local_1d0.argv_[iVar3];
          iVar2 = iVar3;
LAB_00104e99:
          if (local_260.bgcolor != 0) {
            iVar2 = 0;
LAB_0010542f:
            enc = (WebPAnimEncoder *)0x0;
            local_248 = 0;
            pcVar8 = local_250;
            goto LAB_001054c0;
          }
          local_1d0.argv_[iVar2] = (char *)0x0;
          local_240 = 1;
        }
        else {
          local_254 = CONCAT31(local_254._1_3_,*pcVar8);
          iVar3 = strcmp(pcVar8,"-kmin");
          if ((iVar3 == 0) && (iVar3 = iVar2 + 1, iVar3 < local_1d0.argc_)) {
            local_1d0.argv_[lVar7] = (char *)0x0;
            local_1fc.kmin = ExUtilGetInt(local_1d0.argv_[iVar3],0,(int *)&local_260);
            iVar2 = iVar3;
            goto LAB_00104e99;
          }
          iVar3 = strcmp(pcVar8,"-kmax");
          if ((iVar3 == 0) && (iVar3 = iVar2 + 1, iVar3 < local_1d0.argc_)) {
            local_1d0.argv_[lVar7] = (char *)0x0;
            local_1fc.kmax = ExUtilGetInt(local_1d0.argv_[iVar3],0,(int *)&local_260);
            iVar2 = iVar3;
            goto LAB_00104e99;
          }
          iVar3 = strcmp(pcVar8,"-loop");
          if ((iVar3 == 0) && (iVar3 = iVar2 + 1, iVar3 < local_1d0.argc_)) {
            local_1d0.argv_[lVar7] = (char *)0x0;
            local_264 = ExUtilGetInt(local_1d0.argv_[iVar3],0,(int *)&local_260);
            iVar2 = iVar3;
            if (-1 < (int)local_264) goto LAB_00104e99;
            iVar2 = 0;
            fprintf(_stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_264);
            goto LAB_0010542f;
          }
          iVar3 = strcmp(pcVar8,"-min_size");
          if (iVar3 == 0) {
            local_1fc.minimize_size = 1;
            goto LAB_00104e99;
          }
          iVar3 = strcmp(pcVar8,"-mixed");
          if (iVar3 == 0) {
            local_1fc.allow_mixed = 1;
            local_1a4.lossless = 0;
            goto LAB_00104e99;
          }
          if ((char)local_254 == '-') {
            if ((pcVar8[1] != 'v') || (pcVar8[2] != '\0')) {
              if ((pcVar8[1] != 'h') || (pcVar8[2] != '\0')) goto LAB_00104e40;
              goto LAB_001052cc;
            }
            local_21c = 1;
            goto LAB_00104e99;
          }
LAB_00104e40:
          iVar3 = strcmp(pcVar8,"-help");
          if (iVar3 == 0) {
LAB_001052cc:
            puts("Usage:\n");
            puts("  img2webp [file-level options] [image files...] [per-frame options...]");
            putchar(10);
            puts("File-level options (only used at the start of compression):");
            puts(" -min_size ............ minimize size");
            puts(" -loop <int> .......... loop count (default: 0, = infinite loop)");
            puts(
                " -kmax <int> .......... maximum number of frame between key-frames\n                        (0=only keyframes)"
                );
            puts(
                " -kmin <int> .......... minimum number of frame between key-frames\n                        (0=disable key-frames altogether)"
                );
            puts(" -mixed ............... use mixed lossy/lossless automatic mode");
            puts(" -v ................... verbose mode");
            puts(" -h ................... this help");
            puts(" -version ............. print version number and exit");
            putchar(10);
            puts("Per-frame options (only used for subsequent images input):");
            puts(" -d <int> ............. frame duration in ms (default: 100)");
            puts(" -lossless  ........... use lossless mode (default)");
            puts(" -lossy ... ........... use lossy mode");
            puts(" -q <float> ........... quality");
            puts(" -m <int> ............. method to use");
            putchar(10);
            puts(
                "example: img2webp -loop 2 in0.png -lossy in1.jpg\n                  -d 80 in2.tiff -o out.webp"
                );
            puts("\nNote: if a single file name is passed as the argument, the arguments will be");
            puts("tokenized from this file. The file name must not start with the character \'-\'.")
            ;
LAB_00105426:
            iVar2 = (int)local_240;
            goto LAB_0010542f;
          }
          iVar3 = strcmp(pcVar8,"-version");
          if (iVar3 == 0) {
            uVar1 = WebPGetEncoderVersion();
            uVar4 = WebPGetMuxVersion();
            printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                   (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff),
                   (ulong)(uVar4 >> 0x10 & 0xff),(ulong)(uVar4 >> 8 & 0xff),uVar4 & 0xff);
            goto LAB_00105426;
          }
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < local_1d0.argc_);
      if ((uint)local_230 != 0) {
LAB_00104f04:
        local_1a4.lossless = 1;
        if (local_1d0.argc_ < 1) {
          enc = (WebPAnimEncoder *)0x0;
          local_248 = 0;
          local_254 = 0;
        }
        else {
          local_240 = CONCAT44(local_240._4_4_,local_1d0.argc_);
          local_238 = 100;
          iVar2 = 0;
          local_234 = 0;
          local_230 = local_230 & 0xffffffff00000000;
          local_254 = 0;
          local_248 = 0;
          enc = (WebPAnimEncoder *)0x0;
          do {
            pcVar8 = local_1d0.argv_[iVar2];
            if (pcVar8 != (char *)0x0) {
              if (*pcVar8 != '-') {
                iVar3 = WebPValidateConfig(&local_1a4);
                if (iVar3 == 0) {
                  main_cold_2();
                }
                else {
                  local_130.use_argb = 1;
                  local_260.bgcolor = 0;
                  local_260.loop_count = 0;
                  local_228 = 0;
                  iVar3 = ImgIoUtilReadFile(local_1d0.argv_[iVar2],(uint8_t **)&local_260,&local_228
                                           );
                  if (iVar3 != 0) {
                    p_Var6 = WebPGuessImageReader((uint8_t *)local_260,local_228);
                    iVar3 = (*p_Var6)((uint8_t *)local_260,local_228,&local_130,1,(Metadata *)0x0);
                    WebPFree((void *)local_260);
                    pcVar8 = local_250;
                    if (iVar3 != 0) {
                      if (enc == (WebPAnimEncoder *)0x0) {
                        local_230 = CONCAT44(local_230._4_4_,local_130.width);
                        local_234 = local_130.height;
                        enc = WebPAnimEncoderNewInternal
                                        (local_130.width,local_130.height,&local_1fc,0x108);
                        if (enc != (WebPAnimEncoder *)0x0) goto LAB_001050a8;
                        main_cold_1();
                        enc = (WebPAnimEncoder *)0x0;
                      }
                      else {
LAB_001050a8:
                        if (((uint)local_230 == local_130.width) && (local_234 == local_130.height))
                        {
                          iVar3 = WebPAnimEncoderAdd(enc,&local_130,local_254,&local_1a4);
                          if (iVar3 != 0) {
                            WebPPictureFree(&local_130);
                            if (local_21c != 0) {
                              fprintf(_stderr,"Added frame #%3d at time %4d (file: %s)\n",local_248)
                              ;
                            }
                            local_254 = local_254 + local_238;
                            local_248 = (ulong)((int)local_248 + 1);
                            goto LAB_001051ee;
                          }
                          fprintf(_stderr,"Error while adding frame #%d\n",local_248);
                        }
                        else {
                          fprintf(_stderr,
                                  "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n"
                                  ,local_248,(ulong)(uint)local_130.width,
                                  (ulong)(uint)local_130.height,local_230 & 0xffffffff,local_234);
                        }
                      }
                      WebPPictureFree(&local_130);
                      pcVar8 = local_250;
                    }
                    goto LAB_001054bd;
                  }
                }
LAB_00105447:
                iVar2 = 0;
                pcVar8 = local_250;
                goto LAB_001054c0;
              }
              local_260 = (WebPMuxAnimParams)((ulong)local_260 & 0xffffffff00000000);
              iVar3 = strcmp(pcVar8,"-lossy");
              if (iVar3 == 0) {
                if (local_1fc.allow_mixed == 0) {
                  local_1a4.lossless = 0;
                }
              }
              else {
                iVar3 = strcmp(pcVar8,"-lossless");
                if (iVar3 == 0) {
                  if (local_1fc.allow_mixed == 0) {
                    local_1a4.lossless = 1;
                  }
                }
                else if (*pcVar8 == '-') {
                  if (((pcVar8[1] == 'q') && (pcVar8[2] == '\0')) && (iVar2 + 1 < (int)local_240)) {
                    local_1a4.quality = ExUtilGetFloat(local_1d0.argv_[iVar2 + 1],(int *)&local_260)
                    ;
                  }
                  else if (((pcVar8[1] == 'm') && (pcVar8[2] == '\0')) &&
                          (iVar2 + 1 < (int)local_240)) {
                    local_1a4.method = ExUtilGetInt(local_1d0.argv_[iVar2 + 1],0,(int *)&local_260);
                  }
                  else {
                    if (((pcVar8[1] != 'd') || (pcVar8[2] != '\0')) || ((int)local_240 <= iVar2 + 1)
                       ) goto LAB_001051c0;
                    local_238 = ExUtilGetInt(local_1d0.argv_[iVar2 + 1],0,(int *)&local_260);
                    if ((int)local_238 < 1) {
                      iVar2 = 0;
                      fprintf(_stderr,"Invalid negative duration (%d)\n",(ulong)local_238);
                      pcVar8 = local_250;
                      goto LAB_001054c0;
                    }
                  }
                  iVar2 = iVar2 + 1;
                }
                else {
LAB_001051c0:
                  local_260.bgcolor = 1;
                  fprintf(_stderr,"Unknown option [%s]\n",pcVar8);
                }
              }
              if (local_260.bgcolor != 0) goto LAB_00105447;
            }
LAB_001051ee:
            iVar2 = iVar2 + 1;
          } while (iVar2 < (int)local_240);
        }
        iVar2 = 0;
        iVar3 = WebPAnimEncoderAdd(enc,(WebPPicture *)0x0,local_254,(WebPConfig *)0x0);
        if ((iVar3 == 0) || (iVar3 = WebPAnimEncoderAssemble(enc,&local_218), iVar3 == 0)) {
          main_cold_3();
          pcVar8 = local_250;
        }
        else {
          iVar2 = 1;
          pcVar8 = local_250;
        }
        goto LAB_001054c0;
      }
    }
    fwrite("No input file(s) for generating animation!\n",0x2b,1,_stderr);
    enc = (WebPAnimEncoder *)0x0;
    iVar2 = (int)local_240;
    pcVar8 = local_250;
  }
LAB_001054c0:
  WebPAnimEncoderDelete(enc);
  if ((iVar2 != 0) && (0 < (int)local_264)) {
    mux = WebPMuxCreateInternal(&local_218,1,0x108);
    iVar2 = 0;
    if (mux != (WebPMux *)0x0) {
      WVar5 = WebPMuxGetFeatures(mux,(uint32_t *)&local_228);
      if (WVar5 != WEBP_MUX_OK) goto LAB_00105582;
      if ((local_228 & 2) == 0) {
        WebPMuxDelete(mux);
        iVar2 = 1;
        goto LAB_00105592;
      }
      WVar5 = WebPMuxGetAnimationParams(mux,&local_260);
      if (WVar5 == WEBP_MUX_OK) {
        local_260.loop_count = local_264;
        WVar5 = WebPMuxSetAnimationParams(mux,&local_260);
        if (WVar5 != WEBP_MUX_OK) goto LAB_00105582;
        WebPFree(local_218.bytes);
        local_218.bytes = (uint8_t *)0x0;
        local_218.size = 0;
        WVar5 = WebPMuxAssemble(mux,&local_218);
        WebPMuxDelete(mux);
        iVar2 = 1;
        if (WVar5 == WEBP_MUX_OK) goto LAB_00105592;
      }
      else {
LAB_00105582:
        WebPMuxDelete(mux);
      }
      main_cold_5();
      iVar2 = 0;
    }
  }
LAB_00105592:
  iVar3 = 1;
  if (iVar2 != 0) {
    if (pcVar8 == (char *)0x0) {
      main_cold_6();
    }
    else {
      iVar2 = ImgIoUtilWriteFile(pcVar8,local_218.bytes,local_218.size);
      if (iVar2 == 0) goto LAB_001055b7;
      fprintf(_stderr,"output file: %s     ",pcVar8);
    }
    iVar3 = 0;
    fprintf(_stderr,"[%d frames, %u bytes].\n",local_248,local_218.size & 0xffffffff);
  }
LAB_001055b7:
  WebPFree(local_218.bytes);
  local_218.bytes = (uint8_t *)0x0;
  local_218.size = 0;
  ExUtilDeleteCommandLineArguments(&local_1d0);
  return iVar3;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(1);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        goto End;
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}